

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void operational_stats_test(bool multi_kv)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  fdb_status fVar5;
  int iVar6;
  uint8_t *puVar7;
  size_t sVar8;
  size_t sVar9;
  fdb_config *fconfig_00;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  kvs_ops_stat *pkVar13;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_ops_info *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar15;
  char *info;
  ulong uVar16;
  btree *unaff_R15;
  btree *pbVar17;
  bool bVar18;
  timeval tVar19;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_latency_stat stat;
  fdb_kvs_ops_info rinfo;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  fdb_doc real_doc;
  char bodybuf [256];
  fdb_config fconfig;
  int iStack_9b4;
  fdb_doc *pfStack_9b0;
  fdb_file_handle *pfStack_9a8;
  undefined4 uStack_9a0;
  undefined3 uStack_99c;
  undefined1 uStack_999;
  fdb_kvs_handle *pfStack_998;
  uint uStack_98c;
  timeval tStack_988;
  timeval tStack_978;
  timeval tStack_968;
  fdb_file_info fStack_958;
  char acStack_910 [1032];
  fdb_config *pfStack_508;
  fdb_kvs_ops_info *pfStack_500;
  fdb_doc *pfStack_4f8;
  btree *pbStack_4f0;
  btree *pbStack_4e8;
  kvs_ops_stat *pkStack_4e0;
  btree *local_4d0;
  fdb_kvs_handle *local_4c8;
  fdb_doc *local_4c0;
  fdb_iterator *local_4b8;
  undefined8 uStack_4b0;
  fdb_kvs_handle *local_4a8 [4];
  undefined1 local_488 [64];
  undefined1 local_448 [88];
  undefined1 local_3f0 [40];
  btree local_3c8;
  char local_378 [256];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  fdb_doc local_228 [3];
  fdb_config local_128;
  
  pcVar12 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  info = (char *)0x0;
  pkStack_4e0 = (kvs_ops_stat *)0x112ad8;
  gettimeofday((timeval *)(local_3f0 + 0x18),(__timezone_ptr_t)0x0);
  pkStack_4e0 = (kvs_ops_stat *)0x112add;
  memleak_start();
  local_4c0 = (fdb_doc *)local_278;
  local_488._0_16_ = (undefined1  [16])0x0;
  local_488._16_8_ = (void *)0x0;
  local_488._24_8_ = (kvs_info *)0x0;
  local_488._32_8_ = (kvs_ops_stat *)0x0;
  local_488._40_8_ = (fdb_file_handle *)0x0;
  local_488._48_8_ = (hbtrie *)0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258._8_8_ = 0;
  local_258._0_8_ = local_378;
  local_238._8_8_ = 0;
  local_238._0_8_ = local_228;
  pkStack_4e0 = (kvs_ops_stat *)0x112b44;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &local_128;
  pkStack_4e0 = (kvs_ops_stat *)0x112b54;
  fdb_get_default_config();
  pkStack_4e0 = (kvs_ops_stat *)0x112b61;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_128.multi_kv_instances = SUB81(pcVar12,0);
  pkStack_4e0 = (kvs_ops_stat *)0x112b94;
  fdb_open((fdb_file_handle **)&local_4c8,"./dummy1",fconfig_00);
  uStack_4b0._4_4_ = (int)CONCAT71(in_register_00000039,multi_kv);
  if (uStack_4b0._4_4_ != 0) {
    fconfig_00 = (fdb_config *)0x3;
    info = (char *)0x18;
    unaff_R15 = (btree *)(local_448 + 0x20);
    unaff_R12 = (fdb_kvs_ops_info *)local_3f0;
    unaff_R13 = logCallbackFunc;
    pcVar12 = "operational_stats_test";
    do {
      pkStack_4e0 = (kvs_ops_stat *)0x112bdc;
      sprintf((char *)unaff_R15,"kv%d",(ulong)fconfig_00 & 0xffffffff);
      pkStack_4e0 = (kvs_ops_stat *)0x112bf4;
      fVar5 = fdb_kvs_open((fdb_file_handle *)local_4c8,
                           (fdb_kvs_handle **)((long)local_4a8 + (long)info),(char *)unaff_R15,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
      pkStack_4e0 = (kvs_ops_stat *)0x112c0c;
      fVar5 = fdb_set_log_callback
                        (local_4a8[(long)fconfig_00],logCallbackFunc,"operational_stats_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113168;
      info = (char *)&((btree *)((long)info + -0x38))->aux;
      bVar18 = fconfig_00 != (fdb_config *)0x0;
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (bVar18);
    local_488._56_8_ = (btree *)0x3;
LAB_00112c66:
    puVar7 = &((btree *)local_488._56_8_)->vsize;
    pcVar12 = local_448 + 0x20;
    fconfig_00 = (fdb_config *)local_488;
    info = (char *)0x0;
    do {
      pkStack_4e0 = (kvs_ops_stat *)0x112ca2;
      sprintf(local_378,"key%d",(ulong)info & 0xffffffff);
      unaff_R13 = (code *)local_228;
      pkStack_4e0 = (kvs_ops_stat *)0x112cbe;
      sprintf((char *)unaff_R13,"body%d",(ulong)info & 0xffffffff);
      unaff_R12 = (fdb_kvs_ops_info *)(&local_3c8.ksize + (long)info * 8);
      pkStack_4e0 = (kvs_ops_stat *)0x112cd1;
      sVar8 = strlen(local_378);
      pkStack_4e0 = (kvs_ops_stat *)0x112cdd;
      sVar9 = strlen((char *)unaff_R13);
      pkStack_4e0 = (kvs_ops_stat *)0x112cff;
      fdb_doc_create((fdb_doc **)unaff_R12,local_378,sVar8 + 1,(void *)0x0,0,unaff_R13,sVar9 + 1);
      info = (char *)((long)info + 1);
      unaff_R15 = (btree *)puVar7;
      do {
        pkStack_4e0 = (kvs_ops_stat *)0x112d15;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_4b0)[(long)unaff_R15],
                        (fdb_doc *)unaff_R12->num_sets);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pkStack_4e0 = (kvs_ops_stat *)0x1130fe;
          operational_stats_test();
LAB_001130fe:
          pkStack_4e0 = (kvs_ops_stat *)0x113103;
          operational_stats_test();
LAB_00113103:
          pkStack_4e0 = (kvs_ops_stat *)0x113115;
          operational_stats_test();
          goto LAB_00113115;
        }
        pkStack_4e0 = (kvs_ops_stat *)0x112d2a;
        fVar5 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_4b0)[(long)unaff_R15],
                           (fdb_kvs_ops_info *)pcVar12);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130fe;
        local_488._0_8_ = info;
        pkStack_4e0 = (kvs_ops_stat *)0x112d47;
        iVar6 = bcmp(pcVar12,fconfig_00,0x38);
        if (iVar6 != 0) goto LAB_00113103;
        pbVar17 = (btree *)((long)&unaff_R15[-1].aux + 7);
        bVar18 = 0 < (long)unaff_R15;
        unaff_R15 = pbVar17;
      } while (pbVar17 != (btree *)0x0 && bVar18);
    } while (info != (char *)0xa);
    info = local_448 + 0x20;
    local_4d0 = (btree *)local_488._56_8_;
    do {
      pkStack_4e0 = (kvs_ops_stat *)0x112d98;
      fdb_iterator_init(local_4a8[(long)local_4d0],&local_4b8,(void *)0x0,0,(void *)0x0,0,0);
      unaff_R15 = &local_3c8;
      pfVar15 = (fdb_doc *)unaff_R13;
      do {
        pkStack_4e0 = (kvs_ops_stat *)0x112daf;
        fVar5 = fdb_iterator_get(local_4b8,&local_4c0);
        unaff_R13 = (code *)local_4c0;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
        fconfig_00 = (fdb_config *)local_4c0->key;
        unaff_R12 = *(fdb_kvs_ops_info **)unaff_R15;
        pcVar12 = (char *)unaff_R12->num_gets;
        pkStack_4e0 = (kvs_ops_stat *)0x112dd7;
        iVar6 = bcmp(fconfig_00,pcVar12,local_4c0->keylen);
        if (iVar6 != 0) goto LAB_00113136;
        fconfig_00 = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        pcVar12 = (char *)unaff_R12[1].num_dels;
        pkStack_4e0 = (kvs_ops_stat *)0x112df7;
        iVar6 = bcmp(fconfig_00,pcVar12,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar6 != 0) goto LAB_00113158;
        pkStack_4e0 = (kvs_ops_stat *)0x112e11;
        fVar5 = fdb_get_kvs_ops_info(local_4a8[(long)local_4d0],(fdb_kvs_ops_info *)info);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113141;
        local_488._40_8_ = (long)(fdb_kvs_handle **)local_488._40_8_ + 1;
        local_488._48_8_ = local_488._48_8_ + 1;
        pkStack_4e0 = (kvs_ops_stat *)0x112e3f;
        iVar6 = bcmp(info,local_488,0x38);
        if (iVar6 != 0) goto LAB_00113146;
        pkStack_4e0 = (kvs_ops_stat *)0x112e51;
        fVar5 = fdb_iterator_next(local_4b8);
        unaff_R15 = (btree *)&unaff_R15->root_bid;
        pfVar15 = (fdb_doc *)unaff_R13;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      local_488._48_8_ = local_488._48_8_ + 1;
      pkStack_4e0 = (kvs_ops_stat *)0x112e70;
      fdb_iterator_close(local_4b8);
      pkStack_4e0 = (kvs_ops_stat *)0x112e7f;
      fdb_commit((fdb_file_handle *)local_4c8,'\x01');
      local_488._16_8_ = (void *)(local_488._16_8_ + 1);
      pkStack_4e0 = (kvs_ops_stat *)0x112e96;
      fVar5 = fdb_get_kvs_ops_info(local_4a8[(long)local_4d0],(fdb_kvs_ops_info *)info);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113184;
      pkStack_4e0 = (kvs_ops_stat *)0x112eb0;
      iVar6 = bcmp(info,local_488,0x38);
      if (iVar6 != 0) goto LAB_00113172;
    } while ((local_4d0 != (btree *)0x0) &&
            (local_488._40_8_ = (fdb_file_handle *)0x0, local_488._48_8_ = (hbtrie *)0x0,
            bVar18 = 0 < (long)local_4d0, local_4d0 = (btree *)((long)&local_4d0[-1].aux + 7),
            bVar18));
    local_488._24_8_ = local_488._24_8_ + 1;
    pkStack_4e0 = (kvs_ops_stat *)0x112ee9;
    fdb_compact((fdb_file_handle *)local_4c8,"./dummy2");
    pkStack_4e0 = (kvs_ops_stat *)0x112efb;
    fVar5 = fdb_get_kvs_ops_info(local_4a8[0],(fdb_kvs_ops_info *)(local_448 + 0x20));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113189;
    pkStack_4e0 = (kvs_ops_stat *)0x112f1a;
    iVar6 = bcmp(local_448 + 0x20,local_488,0x38);
    info = (char *)local_488._56_8_;
    if (iVar6 == 0) {
      unaff_R15 = (btree *)(local_488._56_8_ + 1);
      unaff_R12 = (fdb_kvs_ops_info *)(local_448 + 0x20);
      unaff_R13 = (code *)local_488;
      pkVar13 = (kvs_ops_stat *)0x0;
      do {
        fconfig_00 = (fdb_config *)((ulong)pkVar13 & 0xffffffff);
        pkStack_4e0 = (kvs_ops_stat *)0x112f56;
        sprintf(local_378,"key%d",(ulong)pkVar13 & 0xffffffff);
        pcVar12 = (char *)((long)&(pkVar13->num_sets).super___atomic_base<unsigned_long>._M_i + 1);
        info = (char *)unaff_R15;
        do {
          if (((ulong)pkVar13 & 1) == 0) {
            if (((ulong)pkVar13 & 2) == 0) {
              pkStack_4e0 = (kvs_ops_stat *)0x112f75;
              fVar5 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
            }
            else {
              local_4c0->seqnum = (fdb_seqnum_t)pcVar12;
              pkStack_4e0 = (kvs_ops_stat *)0x112f9b;
              fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
            }
          }
          else {
            pkStack_4e0 = (kvs_ops_stat *)0x112f86;
            fVar5 = fdb_get((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
          }
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113115;
          pkStack_4e0 = (kvs_ops_stat *)0x112fb0;
          fVar5 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_4b0)[(long)info],unaff_R12);
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
          pkStack_4e0 = (kvs_ops_stat *)0x112fcd;
          local_488._32_8_ = pcVar12;
          iVar6 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar6 != 0) goto LAB_0011311f;
          pbVar17 = (btree *)((long)&((btree *)((long)info + -0x38))->aux + 7);
          bVar18 = 0 < (long)info;
          info = (char *)pbVar17;
        } while (pbVar17 != (btree *)0x0 && bVar18);
        pkVar13 = (kvs_ops_stat *)pcVar12;
      } while ((kvs_ops_stat *)pcVar12 != (kvs_ops_stat *)0xa);
      fconfig_00 = (fdb_config *)local_448;
      unaff_R15 = (btree *)&stderr;
      info = "%d:\t%u\t%u\t%u\t%lu\n";
      pcVar12 = (char *)0x0;
      while( true ) {
        local_448._0_16_ = (undefined1  [16])0x0;
        local_448._16_8_ = (docio_handle *)0x0;
        pkStack_4e0 = (kvs_ops_stat *)0x113029;
        fVar5 = fdb_get_latency_stats
                          ((fdb_file_handle *)local_4c8,(fdb_latency_stat *)fconfig_00,
                           (fdb_latency_stat_type)pcVar12);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pkStack_4e0 = (kvs_ops_stat *)0x11305e;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",pcVar12);
        uVar11 = (int)pcVar12 + 1;
        pcVar12 = (char *)(ulong)uVar11;
        if (uVar11 == 0x13) {
          pkStack_4e0 = (kvs_ops_stat *)0x11306f;
          fdb_close((fdb_file_handle *)local_4c8);
          lVar10 = 0;
          do {
            pkStack_4e0 = (kvs_ops_stat *)0x11307e;
            fdb_doc_free(*(fdb_doc **)(&local_3c8.ksize + lVar10 * 8));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 10);
          pkStack_4e0 = (kvs_ops_stat *)0x11308c;
          fdb_shutdown();
          pkStack_4e0 = (kvs_ops_stat *)0x113091;
          memleak_end();
          pcVar12 = "single kv instance";
          if (uStack_4b0._4_1_ != '\0') {
            pcVar12 = "multiple kv instances";
          }
          pkStack_4e0 = (kvs_ops_stat *)0x1130c1;
          sprintf((char *)local_228,"Operational stats test %s",pcVar12);
          pcVar12 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          pkStack_4e0 = (kvs_ops_stat *)0x1130e7;
          fprintf(_stderr,pcVar12,local_228);
          return;
        }
      }
      goto LAB_00113163;
    }
    goto LAB_0011318e;
  }
  pkStack_4e0 = (kvs_ops_stat *)0x112c3c;
  pfVar14 = local_4c8;
  fVar5 = fdb_kvs_open_default((fdb_file_handle *)local_4c8,local_4a8,(fdb_kvs_config *)local_3f0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pkStack_4e0 = (kvs_ops_stat *)0x112c5c;
    pfVar14 = local_4a8[0];
    fVar5 = fdb_set_log_callback(local_4a8[0],logCallbackFunc,"operational_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001131a5;
    local_488._56_8_ = (btree *)0x0;
    goto LAB_00112c66;
  }
  goto LAB_001131a0;
LAB_00113115:
  pkStack_4e0 = (kvs_ops_stat *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pkStack_4e0 = (kvs_ops_stat *)0x11311f;
  operational_stats_test();
LAB_0011311f:
  pkStack_4e0 = (kvs_ops_stat *)0x113131;
  operational_stats_test();
  pfVar15 = (fdb_doc *)unaff_R13;
LAB_00113131:
  unaff_R13 = (code *)pfVar15;
  pkStack_4e0 = (kvs_ops_stat *)0x113136;
  operational_stats_test();
LAB_00113136:
  pkStack_4e0 = (kvs_ops_stat *)0x113141;
  operational_stats_test();
LAB_00113141:
  pkStack_4e0 = (kvs_ops_stat *)0x113146;
  operational_stats_test();
LAB_00113146:
  pkStack_4e0 = (kvs_ops_stat *)0x113158;
  operational_stats_test();
LAB_00113158:
  pkStack_4e0 = (kvs_ops_stat *)0x113163;
  operational_stats_test();
LAB_00113163:
  pkStack_4e0 = (kvs_ops_stat *)0x113168;
  operational_stats_test();
LAB_00113168:
  pkStack_4e0 = (kvs_ops_stat *)0x11316d;
  operational_stats_test();
LAB_0011316d:
  pkStack_4e0 = (kvs_ops_stat *)0x113172;
  operational_stats_test();
LAB_00113172:
  pkStack_4e0 = (kvs_ops_stat *)0x113184;
  operational_stats_test();
LAB_00113184:
  pkStack_4e0 = (kvs_ops_stat *)0x113189;
  operational_stats_test();
LAB_00113189:
  pkStack_4e0 = (kvs_ops_stat *)0x11318e;
  operational_stats_test();
LAB_0011318e:
  pfVar14 = (fdb_kvs_handle *)local_488;
  pkStack_4e0 = (kvs_ops_stat *)0x1131a0;
  operational_stats_test();
LAB_001131a0:
  pkStack_4e0 = (kvs_ops_stat *)0x1131a5;
  operational_stats_test();
LAB_001131a5:
  pkStack_4e0 = (kvs_ops_stat *)_worker_thread;
  operational_stats_test();
  pfStack_508 = fconfig_00;
  pfStack_500 = unaff_R12;
  pfStack_4f8 = (fdb_doc *)unaff_R13;
  pbStack_4f0 = (btree *)info;
  pbStack_4e8 = unaff_R15;
  pkStack_4e0 = (kvs_ops_stat *)pcVar12;
  gettimeofday(&tStack_968,(__timezone_ptr_t)0x0);
  pfStack_9b0 = (fdb_doc *)0x0;
  sprintf(acStack_910,"dummy%d",(ulong)*(uint *)&pfVar14->file->filename);
  fdb_open(&pfStack_9a8,acStack_910,(fdb_config *)pfVar14->btreeblkops);
  fdb_kvs_open_default(pfStack_9a8,&pfStack_998,(fdb_kvs_config *)pfVar14->fileops);
  fVar5 = fdb_set_log_callback(pfStack_998,logCallbackFunc,"worker_thread");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
  *(int *)(pfVar14->field_6).seqtree = *(int *)(pfVar14->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
    pbVar17 = (pfVar14->field_6).seqtree;
    iVar6._0_1_ = pbVar17->ksize;
    iVar6._1_1_ = pbVar17->vsize;
    iVar6._2_2_ = pbVar17->height;
    if ((list *)(pfVar14->kvs_config).custom_cmp == (list *)(long)iVar6) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
  gettimeofday((timeval *)&tStack_978,(__timezone_ptr_t)0x0);
  uStack_999 = 0;
  uVar16 = 0;
  iStack_9b4 = 0;
  do {
    iVar6 = rand();
    iVar6 = (int)((ulong)(long)iVar6 % (ulong)(pfVar14->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar14->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_9b0,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar5 = fdb_get(pfStack_998,pfStack_9b0);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_9b0->body;
    plVar3 = *(long **)((&pfVar14->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar14->kvs != (kvs_info *)0x0) {
      uStack_9a0 = (undefined4)plVar2[1];
      uStack_99c = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar6 = atoi((char *)&uStack_9a0);
      sprintf((char *)&uStack_9a0,"%0 7d",(ulong)(iVar6 + 1));
      pvVar4 = pfStack_9b0->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_99c,uStack_9a0._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_9a0;
      fVar5 = fdb_set(pfStack_998,pfStack_9b0);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar14->trie != (hbtrie *)0x0) && (uVar16 % (ulong)pfVar14->trie == 0)) {
        fdb_commit(pfStack_9a8,'\0');
        iStack_9b4 = iStack_9b4 + 1;
        fdb_get_file_info(pfStack_9a8,&fStack_958);
        if ((pfVar14->staletree == (btree *)(long)iStack_9b4) &&
           (((pfVar14->staletree != (btree *)0x0 && (fStack_958.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar14->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
          uStack_98c = *(int *)&pfVar14->file->filename + 1;
          *(uint *)&pfVar14->file->filename = uStack_98c;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
          iStack_9b4 = 0;
          sprintf(acStack_910,"dummy%d",(ulong)uStack_98c);
          fVar5 = fdb_compact(pfStack_9a8,acStack_910);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
            *(int *)&pfVar14->file->filename = *(int *)&pfVar14->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_9b0);
    pfStack_9b0 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
    gettimeofday((timeval *)&tStack_988,(__timezone_ptr_t)0x0);
    tVar19 = _utime_gap(tStack_978,tStack_988);
  } while ((fdb_file_handle *)tVar19.tv_sec < pfVar14->fhandle);
  pcVar12 = "writer";
  if (pfVar14->kvs == (kvs_info *)0x0) {
    pcVar12 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar14->kvs_config,pcVar12,
         uVar16 & 0xffffffff);
  pfVar14->bhandle = (btreeblk_handle *)(uVar16 & 0xffffffff);
  fdb_commit(pfStack_9a8,'\x01');
  fdb_kvs_close(pfStack_998);
  fdb_close(pfStack_9a8);
  pthread_exit((void *)0x0);
}

Assistant:

void operational_stats_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_kvs_ops_info info, rinfo;

    char keybuf[256], bodybuf[256];
    memset(&info, 0, sizeof(fdb_kvs_ops_info));
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "operational_stats_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "operational_stats_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_sets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ++info.num_iterator_gets;
            ++info.num_iterator_moves;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
            ++i;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        ++info.num_iterator_moves; // account for the last move that failed
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        ++info.num_commits;

        status = fdb_get_kvs_ops_info(db[r], &rinfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

        if (r) {
            info.num_iterator_gets = 0;
            info.num_iterator_moves = 0;
        }
    }

    ++info.num_compacts;
    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    status = fdb_get_kvs_ops_info(db[0], &rinfo);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            if (i % 2 == 0) {
                if (i % 4 == 0) {
                    status = fdb_get_metaonly(db[r], rdoc);
                } else {
                    rdoc->seqnum = i + 1;
                    status = fdb_get_byseq(db[r], rdoc);
                }
            } else {
                status = fdb_get(db[r], rdoc);
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_gets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }
    // also get latency stats..
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        fdb_latency_stat stat;
        memset(&stat, 0, sizeof(fdb_latency_stat));
        status = fdb_get_latency_stats(dbfile, &stat, i);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fprintf(stderr, "%d:\t%u\t%u\t%u\t%" _F64 "\n", i,
                stat.lat_max, stat.lat_avg, stat.lat_max, stat.lat_count);
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Operational stats test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}